

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

void CoreML::Specification::protobuf_Model_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_003a3e90 == '\x01') {
    DAT_003a3e90 = '\0';
    (*(code *)*_Pipeline_default_instance_)();
  }
  if (DAT_003a3eb8 == '\x01') {
    DAT_003a3eb8 = '\0';
    (*(code *)*_PipelineClassifier_default_instance_)();
  }
  if (DAT_003a3ee0 == '\x01') {
    DAT_003a3ee0 = '\0';
    (*(code *)*_PipelineRegressor_default_instance_)();
  }
  if (DAT_003a3f18 == '\x01') {
    DAT_003a3f18 = '\0';
    (*(code *)*_FeatureDescription_default_instance_)();
  }
  if (DAT_003a3fb0 == '\x01') {
    DAT_003a3fb0 = '\0';
    (*(code *)*_Metadata_default_instance_)();
  }
  if (DAT_003a4030 == '\x01') {
    DAT_003a4030 = '\0';
    (*(code *)*_ModelDescription_default_instance_)();
  }
  if (DAT_003a4060 == '\x01') {
    DAT_003a4060 = '\0';
    (*(code *)*_SerializedModel_default_instance_)();
  }
  if (DAT_003a4098 == '\x01') {
    DAT_003a4098 = 0;
    (*(code *)*_Model_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _Pipeline_default_instance_.Shutdown();
  _PipelineClassifier_default_instance_.Shutdown();
  _PipelineRegressor_default_instance_.Shutdown();
  _FeatureDescription_default_instance_.Shutdown();
  _Metadata_default_instance_.Shutdown();
  _ModelDescription_default_instance_.Shutdown();
  _SerializedModel_default_instance_.Shutdown();
  _Model_default_instance_.Shutdown();
}